

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O2

BVHNodeRecord<embree::NodeRefPtr<4>_> * __thiscall
embree::avx::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::avx::SetBVHNBounds<4>,_embree::avx::CreateMortonLeaf<4,_embree::TriangleMi<4>_>,_embree::avx::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(BVHNodeRecord<embree::NodeRefPtr<4>_> *__return_storage_ptr__,
                 BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::avx::SetBVHNBounds<4>,_embree::avx::CreateMortonLeaf<4,_embree::TriangleMi<4>_>,_embree::avx::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,size_t depth,range<unsigned_int> *current,CachedAllocator alloc)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar1;
  atomic<unsigned_long> *paVar2;
  char *pcVar3;
  Vec3fx VVar4;
  undefined4 uVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  CachedAllocator alloc_00;
  FastAllocator *this_00;
  ThreadLocal *pTVar7;
  ulong uVar8;
  size_t i_1;
  long lVar9;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar10;
  float *pfVar11;
  size_t sVar12;
  undefined8 *puVar13;
  ulong uVar14;
  range<unsigned_int> *current_00;
  ulong uVar15;
  ulong uVar16;
  range<unsigned_int> rVar17;
  uint uVar18;
  ulong uVar19;
  range<unsigned_int> rVar20;
  ulong uVar21;
  ulong uVar22;
  char *pcVar23;
  ulong uVar24;
  Vec3fx *pVVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  ulong local_270;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  BVHNodeRecord<embree::NodeRefPtr<4>_> *local_240;
  BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::avx::SetBVHNBounds<4>,_embree::avx::CreateMortonLeaf<4,_embree::TriangleMi<4>_>,_embree::avx::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
  *local_238;
  range<unsigned_int> local_230;
  range<unsigned_int> children [8];
  undefined1 local_1e8 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_1d8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_1c8;
  BVHNodeRecord<embree::NodeRefPtr<4>_> bounds [8];
  
  this_00 = alloc.alloc;
  pTVar7 = alloc.talloc0;
  if ((this->super_Settings).maxDepth < depth) {
    puVar13 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)bounds,"depth limit reached",(allocator *)children);
    *puVar13 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar13 + 1) = 1;
    std::__cxx11::string::string((string *)(puVar13 + 2),(string *)bounds);
    __cxa_throw(puVar13,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  uVar21 = (this->super_Settings).maxLeafSize;
  if (current->_end - current->_begin <= uVar21) {
    CreateMortonLeaf<4,_embree::TriangleMi<4>_>::operator()
              (__return_storage_ptr__,this->createLeaf,current,&alloc);
    return __return_storage_ptr__;
  }
  children[0] = *current;
  uVar24 = (this->super_Settings).branchingFactor;
  uVar14 = 1;
  do {
    uVar16 = 0;
    uVar22 = 0xffffffffffffffff;
    for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
      uVar19 = (ulong)(children[uVar15]._end - children[uVar15]._begin);
      uVar8 = uVar15;
      if (uVar19 <= uVar21 || uVar19 <= uVar16) {
        uVar19 = uVar16;
        uVar8 = uVar22;
      }
      uVar22 = uVar8;
      uVar16 = uVar19;
    }
    if (uVar22 == 0xffffffffffffffff) break;
    uVar18 = children[uVar22]._end + children[uVar22]._begin >> 1;
    rVar17._end = children[uVar22]._end;
    rVar17._begin = uVar18;
    rVar20._end = uVar18;
    rVar20._begin = children[uVar22]._begin;
    children[uVar22] = children[uVar14 - 1];
    children[uVar14 - 1] = rVar20;
    children[uVar14] = rVar17;
    uVar14 = uVar14 + 1;
  } while (uVar14 < uVar24);
  local_270 = 0x80;
  rVar17 = (range<unsigned_int>)(alloc.talloc0)->parent;
  if (alloc.alloc != (((atomic<embree::FastAllocator_*> *)((long)rVar17 + 8))->_M_b)._M_p) {
    local_1e8[8] = true;
    local_1e8._0_8_ = rVar17;
    MutexSys::lock((MutexSys *)rVar17);
    if ((((atomic<embree::FastAllocator_*> *)((long)rVar17 + 8))->_M_b)._M_p != (__pointer_type)0x0)
    {
      LOCK();
      paVar2 = &((((atomic<embree::FastAllocator_*> *)((long)rVar17 + 8))->_M_b)._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (long)*(void **)((long)rVar17 + 0xa8) + (long)*(void **)((long)rVar17 + 0x68);
      UNLOCK();
      LOCK();
      paVar2 = &((((atomic<embree::FastAllocator_*> *)((long)rVar17 + 8))->_M_b)._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((long)*(void **)((long)rVar17 + 0x58) + (long)*(void **)((long)rVar17 + 0x98)) -
           ((long)*(void **)((long)rVar17 + 0x50) + (long)*(void **)((long)rVar17 + 0x90)));
      UNLOCK();
      LOCK();
      paVar2 = &((((atomic<embree::FastAllocator_*> *)((long)rVar17 + 8))->_M_b)._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (long)*(void **)((long)rVar17 + 0xb0) + (long)*(void **)((long)rVar17 + 0x70);
      UNLOCK();
    }
    auVar27 = ZEXT816(0) << 0x40;
    *(undefined1 (*) [32])((long)rVar17 + 0x58) = ZEXT1632(auVar27);
    *(undefined1 (*) [32])((long)rVar17 + 0x48) = ZEXT1632(auVar27);
    auVar28 = ZEXT1632(auVar27);
    if (this_00 == (FastAllocator *)0x0) {
      *(undefined1 (*) [32])((long)rVar17 + 0x98) = auVar28;
      *(undefined1 (*) [32])((long)rVar17 + 0x88) = auVar28;
    }
    else {
      *(void **)((long)rVar17 + 0x60) = (void *)this_00->defaultBlockSize;
      *(undefined1 (*) [32])((long)rVar17 + 0x88) = auVar28;
      *(undefined1 (*) [32])((long)rVar17 + 0x98) = auVar28;
      *(void **)((long)rVar17 + 0xa0) = (void *)this_00->defaultBlockSize;
    }
    LOCK();
    (((atomic<embree::FastAllocator_*> *)((long)rVar17 + 8))->_M_b)._M_p = this_00;
    UNLOCK();
    bounds[0].ref.ptr = (size_t)&FastAllocator::s_thread_local_allocators_lock;
    bounds[0]._8_1_ = 1;
    local_230 = rVar17;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,(value_type *)&local_230);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)bounds);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)local_1e8);
  }
  uVar21 = local_270;
  pTVar7->bytesUsed = pTVar7->bytesUsed + local_270;
  sVar12 = pTVar7->cur;
  uVar24 = (ulong)(-(int)sVar12 & 0xf);
  uVar22 = sVar12 + local_270 + uVar24;
  pTVar7->cur = uVar22;
  local_240 = __return_storage_ptr__;
  local_238 = this;
  if (pTVar7->end < uVar22) {
    pTVar7->cur = sVar12;
    uVar24 = pTVar7->allocBlockSize;
    if (local_270 * 4 < uVar24 || local_270 * 4 - uVar24 == 0) {
      bounds[0].ref.ptr = uVar24;
      pcVar23 = (char *)FastAllocator::malloc(this_00,(size_t)bounds);
      pTVar7->ptr = pcVar23;
      sVar12 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
      pTVar7->bytesWasted = sVar12;
      pTVar7->end = bounds[0].ref.ptr;
      pTVar7->cur = uVar21;
      if (bounds[0].ref.ptr < uVar21) {
        pTVar7->cur = 0;
        bounds[0].ref.ptr = pTVar7->allocBlockSize;
        pcVar23 = (char *)FastAllocator::malloc(this_00,(size_t)bounds);
        pTVar7->ptr = pcVar23;
        sVar12 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
        pTVar7->bytesWasted = sVar12;
        pTVar7->end = bounds[0].ref.ptr;
        pTVar7->cur = uVar21;
        if (bounds[0].ref.ptr < uVar21) {
          pTVar7->cur = 0;
          pcVar23 = (char *)0x0;
          goto LAB_00dfdf50;
        }
      }
      pTVar7->bytesWasted = sVar12;
    }
    else {
      pcVar23 = (char *)FastAllocator::malloc(this_00,(size_t)&local_270);
    }
  }
  else {
    pTVar7->bytesWasted = pTVar7->bytesWasted + uVar24;
    pcVar23 = pTVar7->ptr + (uVar22 - local_270);
  }
LAB_00dfdf50:
  pcVar23[0x60] = '\0';
  pcVar23[0x61] = '\0';
  pcVar23[0x62] = -0x80;
  pcVar23[99] = '\x7f';
  pcVar23[100] = '\0';
  pcVar23[0x65] = '\0';
  pcVar23[0x66] = -0x80;
  pcVar23[0x67] = '\x7f';
  pcVar23[0x68] = '\0';
  pcVar23[0x69] = '\0';
  pcVar23[0x6a] = -0x80;
  pcVar23[0x6b] = '\x7f';
  pcVar23[0x6c] = '\0';
  pcVar23[0x6d] = '\0';
  pcVar23[0x6e] = -0x80;
  pcVar23[0x6f] = '\x7f';
  pcVar23[0x40] = '\0';
  pcVar23[0x41] = '\0';
  pcVar23[0x42] = -0x80;
  pcVar23[0x43] = '\x7f';
  pcVar23[0x44] = '\0';
  pcVar23[0x45] = '\0';
  pcVar23[0x46] = -0x80;
  pcVar23[0x47] = '\x7f';
  pcVar23[0x48] = '\0';
  pcVar23[0x49] = '\0';
  pcVar23[0x4a] = -0x80;
  pcVar23[0x4b] = '\x7f';
  pcVar23[0x4c] = '\0';
  pcVar23[0x4d] = '\0';
  pcVar23[0x4e] = -0x80;
  pcVar23[0x4f] = '\x7f';
  local_258._8_4_ = 0x7f800000;
  local_258._0_8_ = 0x7f8000007f800000;
  local_258._12_4_ = 0x7f800000;
  pcVar23[0x20] = '\0';
  pcVar23[0x21] = '\0';
  pcVar23[0x22] = -0x80;
  pcVar23[0x23] = '\x7f';
  pcVar23[0x24] = '\0';
  pcVar23[0x25] = '\0';
  pcVar23[0x26] = -0x80;
  pcVar23[0x27] = '\x7f';
  pcVar23[0x28] = '\0';
  pcVar23[0x29] = '\0';
  pcVar23[0x2a] = -0x80;
  pcVar23[0x2b] = '\x7f';
  pcVar23[0x2c] = '\0';
  pcVar23[0x2d] = '\0';
  pcVar23[0x2e] = -0x80;
  pcVar23[0x2f] = '\x7f';
  pcVar23[0x70] = '\0';
  pcVar23[0x71] = '\0';
  pcVar23[0x72] = -0x80;
  pcVar23[0x73] = -1;
  pcVar23[0x74] = '\0';
  pcVar23[0x75] = '\0';
  pcVar23[0x76] = -0x80;
  pcVar23[0x77] = -1;
  pcVar23[0x78] = '\0';
  pcVar23[0x79] = '\0';
  pcVar23[0x7a] = -0x80;
  pcVar23[0x7b] = -1;
  pcVar23[0x7c] = '\0';
  pcVar23[0x7d] = '\0';
  pcVar23[0x7e] = -0x80;
  pcVar23[0x7f] = -1;
  pcVar23[0x50] = '\0';
  pcVar23[0x51] = '\0';
  pcVar23[0x52] = -0x80;
  pcVar23[0x53] = -1;
  pcVar23[0x54] = '\0';
  pcVar23[0x55] = '\0';
  pcVar23[0x56] = -0x80;
  pcVar23[0x57] = -1;
  pcVar23[0x58] = '\0';
  pcVar23[0x59] = '\0';
  pcVar23[0x5a] = -0x80;
  pcVar23[0x5b] = -1;
  pcVar23[0x5c] = '\0';
  pcVar23[0x5d] = '\0';
  pcVar23[0x5e] = -0x80;
  pcVar23[0x5f] = -1;
  local_268._8_4_ = 0xff800000;
  local_268._0_8_ = 0xff800000ff800000;
  local_268._12_4_ = 0xff800000;
  pcVar23[0x30] = '\0';
  pcVar23[0x31] = '\0';
  pcVar23[0x32] = -0x80;
  pcVar23[0x33] = -1;
  pcVar23[0x34] = '\0';
  pcVar23[0x35] = '\0';
  pcVar23[0x36] = -0x80;
  pcVar23[0x37] = -1;
  pcVar23[0x38] = '\0';
  pcVar23[0x39] = '\0';
  pcVar23[0x3a] = -0x80;
  pcVar23[0x3b] = -1;
  pcVar23[0x3c] = '\0';
  pcVar23[0x3d] = '\0';
  pcVar23[0x3e] = -0x80;
  pcVar23[0x3f] = -1;
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    pcVar3 = pcVar23 + lVar9 * 8;
    pcVar3[0] = '\b';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
  }
  current_00 = children;
  pVVar25 = &bounds[0].bounds.upper;
  uVar21 = uVar14;
  while (bVar26 = uVar21 != 0, uVar21 = uVar21 - 1, bVar26) {
    alloc_00.talloc0 = alloc.talloc0;
    alloc_00.alloc = alloc.alloc;
    alloc_00.talloc1 = alloc.talloc1;
    createLargeLeaf((BVHNodeRecord<embree::NodeRefPtr<4>_> *)local_1e8,local_238,depth + 1,
                    current_00,alloc_00);
    *(uint *)&pVVar25[-2].field_0 = local_1e8._0_4_;
    *(undefined4 *)((long)&pVVar25[-2].field_0 + 4) = local_1e8._4_4_;
    *(undefined8 *)&(((BBox3fx *)(pVVar25 + -1))->lower).field_0 = local_1d8._0_8_;
    *(undefined8 *)((long)&(((BBox3fx *)(pVVar25 + -1))->lower).field_0 + 8) = local_1d8._8_8_;
    *(undefined8 *)&pVVar25->field_0 = local_1c8._0_8_;
    *(undefined8 *)((long)&pVVar25->field_0 + 8) = local_1c8._8_8_;
    current_00 = current_00 + 1;
    pVVar25 = pVVar25 + 3;
  }
  paVar10 = &bounds[0].bounds.upper.field_0;
  for (uVar21 = 0; uVar14 != uVar21; uVar21 = uVar21 + 1) {
    paVar1 = paVar10 + -1;
    auVar27._0_4_ = *(float *)paVar1;
    auVar27._4_4_ = *(float *)((long)paVar1 + 4);
    auVar27._8_4_ = *(float *)((long)paVar1 + 8);
    auVar27._12_4_ =
         *(anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
           *)((long)paVar1 + 0xc);
    VVar4.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fx_0)
         *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)&paVar10->field_1;
    *(undefined8 *)(pcVar23 + uVar21 * 8) = *(undefined8 *)(paVar10 + -2);
    *(undefined4 *)(pcVar23 + uVar21 * 4 + 0x20) = auVar27._0_4_;
    uVar5 = vextractps_avx(auVar27,1);
    *(undefined4 *)(pcVar23 + uVar21 * 4 + 0x40) = uVar5;
    uVar5 = vextractps_avx(auVar27,2);
    *(undefined4 *)(pcVar23 + uVar21 * 4 + 0x60) = uVar5;
    *(int *)(pcVar23 + uVar21 * 4 + 0x30) = VVar4.field_0._0_4_;
    uVar5 = vextractps_avx((undefined1  [16])VVar4.field_0,1);
    *(undefined4 *)(pcVar23 + uVar21 * 4 + 0x50) = uVar5;
    uVar5 = vextractps_avx((undefined1  [16])VVar4.field_0,2);
    *(undefined4 *)(pcVar23 + uVar21 * 4 + 0x70) = uVar5;
    local_258 = vminps_avx(local_258,auVar27);
    local_268 = vmaxps_avx(local_268,(undefined1  [16])VVar4.field_0);
    paVar10 = paVar10 + 3;
  }
  pfVar11 = bounds[0].bounds.lower.field_0.m128 + 3;
  uVar24 = 0;
  uVar21 = uVar14;
  while (bVar26 = uVar21 != 0, uVar21 = uVar21 - 1, bVar26) {
    uVar24 = uVar24 + (long)(int)*pfVar11;
    pfVar11 = pfVar11 + 0xc;
  }
  if (0xfff < uVar24) {
    pfVar11 = bounds[0].bounds.lower.field_0.m128 + 3;
    for (uVar21 = 0; uVar14 != uVar21; uVar21 = uVar21 + 1) {
      if ((int)*pfVar11 < 0x1000) {
        BVHNRotate<4>::rotate((NodeRef)*(size_t *)(pcVar23 + uVar21 * 8),1);
        pcVar23[uVar21 * 8 + 7] = pcVar23[uVar21 * 8 + 7] | 0x80;
      }
      pfVar11 = pfVar11 + 0xc;
    }
  }
  aVar6 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(local_258,ZEXT416((uint)uVar24),0x30)
  ;
  (local_240->ref).ptr = (size_t)pcVar23;
  (local_240->bounds).lower.field_0 = aVar6;
  *(undefined8 *)&(local_240->bounds).upper.field_0 = local_268._0_8_;
  *(undefined8 *)((long)&(local_240->bounds).upper.field_0 + 8) = local_268._8_8_;
  return local_240;
}

Assistant:

ReductionTy createLargeLeaf(size_t depth, const range<unsigned>& current, Allocator alloc)
        {
          /* this should never occur but is a fatal error */
          if (depth > maxDepth)
            throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

          /* create leaf for few primitives */
          if (current.size() <= maxLeafSize)
            return createLeaf(current,alloc);

          /* fill all children by always splitting the largest one */
          range<unsigned> children[MAX_BRANCHING_FACTOR];
          size_t numChildren = 1;
          children[0] = current;

          do {

            /* find best child with largest number of primitives */
            size_t bestChild = -1;
            size_t bestSize = 0;
            for (size_t i=0; i<numChildren; i++)
            {
              /* ignore leaves as they cannot get split */
              if (children[i].size() <= maxLeafSize)
                continue;

              /* remember child with largest size */
              if (children[i].size() > bestSize) {
                bestSize = children[i].size();
                bestChild = i;
              }
            }
            if (bestChild == size_t(-1)) break;

            /*! split best child into left and right child */
            auto split = children[bestChild].split();

            /* add new children left and right */
            children[bestChild] = children[numChildren-1];
            children[numChildren-1] = split.first;
            children[numChildren+0] = split.second;
            numChildren++;

          } while (numChildren < branchingFactor);

          /* create node */
          auto node = createNode(alloc,numChildren);

          /* recurse into each child */
          ReductionTy bounds[MAX_BRANCHING_FACTOR];
          for (size_t i=0; i<numChildren; i++)
            bounds[i] = createLargeLeaf(depth+1,children[i],alloc);

          return setBounds(node,bounds,numChildren);
        }